

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  int iVar4;
  undefined4 uVar5;
  char *pcVar6;
  pointer puVar7;
  undefined8 uVar8;
  size_t sVar9;
  long *plVar10;
  ostream *poVar11;
  pointer pbVar12;
  char *__s;
  pointer this_00;
  pointer s;
  undefined *puVar13;
  pointer ppcVar14;
  bool bVar15;
  string default_config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string odir;
  string homedir;
  string file;
  cmGeneratedFileStream fout;
  undefined1 auStack_398 [15];
  allocator local_389;
  cmLocalGenerator *local_388;
  undefined1 local_380 [16];
  undefined1 local_370 [24];
  pointer *local_358;
  pointer local_350;
  pointer local_348 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_318;
  string local_300;
  long *local_2e0;
  size_t local_2d8;
  long local_2d0 [2];
  long *local_2c0;
  size_t local_2b8;
  long local_2b0 [2];
  string local_2a0;
  char *local_280;
  undefined1 local_278 [584];
  
  pcVar3 = this->Makefile;
  pcVar1 = local_278 + 0x10;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_INSTALL_PREFIX","");
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  __s = "/usr/local";
  if (pcVar6 != (char *)0x0) {
    __s = pcVar6;
  }
  pcVar3 = this->Makefile;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_STAGING_PREFIX","");
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (pcVar6 != (char *)0x0) {
    __s = pcVar6;
  }
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_2a0,this->Makefile,&local_338,false);
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,local_2a0._M_dataplus._M_p,
             local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
  if (local_350 == (pointer)0x0) {
    puVar13 = &DAT_0068ba40;
    puVar7 = (pointer)0x0;
    pbVar12 = local_338.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_388 = this;
    local_280 = __s;
    do {
      s = local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      if (local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == pbVar12) {
        bVar15 = true;
      }
      else {
        do {
          cmsys::SystemTools::UpperCase((string *)local_278,s);
          iVar4 = std::__cxx11::string::compare((char *)local_278);
          if ((pointer)local_278._0_8_ != pcVar1) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if (iVar4 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_358);
          }
          pbVar12 = s + 1;
          s = pbVar12;
        } while (pbVar12 !=
                 local_338.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        bVar15 = local_350 == (pointer)0x0;
        puVar7 = local_350;
      }
      __s = local_280;
      this = local_388;
    } while ((*(long *)(puVar13 + 8) != 0) && (puVar13 = puVar13 + 8, bVar15));
    if ((puVar7 == (pointer)0x0) &&
       (local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::_M_assign((string *)&local_358);
    }
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_278,&this->StateSnapshot);
  pcVar6 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_278);
  std::__cxx11::string::string((string *)&local_2c0,pcVar6,(allocator *)local_380);
  pcVar6 = cmState::GetBinaryDirectory(this->GlobalGenerator->CMakeInstance->State);
  uVar8 = std::__cxx11::string::string((string *)&local_2e0,pcVar6,(allocator *)local_278);
  if (local_2b8 == local_2d8) {
    if (local_2b8 == 0) {
      uVar5 = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
    }
    else {
      iVar4 = bcmp(local_2c0,local_2e0,local_2b8);
      uVar5 = CONCAT31((int3)((uint)iVar4 >> 8),iVar4 == 0);
    }
    local_388 = (cmLocalGenerator *)CONCAT44(local_388._4_4_,uVar5);
  }
  else {
    local_388 = (cmLocalGenerator *)((ulong)local_388 & 0xffffffff00000000);
  }
  std::__cxx11::string::append((char *)&local_2c0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_2c0,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# Install script for directory: ",0x20);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_380,&this->StateSnapshot);
  pcVar6 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_380);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_398 + (int)*(undefined8 *)(local_278._0_8_ + -0x18) + 0x120);
  }
  else {
    sVar9 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar9);
  }
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# Set the install prefix",0x18);
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  poVar11 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)",0x24);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  poVar11 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  set(CMAKE_INSTALL_PREFIX \"",0x1c);
  sVar9 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,__s,sVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\")",2);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  poVar11 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"endif()",7);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  poVar11 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"${CMAKE_INSTALL_PREFIX}\")",0x1a);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
             ,0xf1);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,(char *)local_358,(long)local_350);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
             ,0xfe);
  pcVar3 = this->Makefile;
  local_380._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"CMAKE_INSTALL_SO_NO_EXE","");
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_380);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  if (pcVar6 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
               ,0x7e);
    sVar9 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")\nendif()\n\n",0xc);
  }
  pcVar3 = this->Makefile;
  local_380._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"CMAKE_CROSSCOMPILING","");
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_380);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370) {
    operator_delete((void *)local_380._0_8_,(ulong)(local_370._0_8_ + 1));
  }
  if (pcVar6 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
               ,0x76);
    sVar9 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")\nendif()\n\n",0xc);
  }
  pcVar3 = this->Makefile;
  ppcVar14 = (pcVar3->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (ppcVar14 !=
      (pcVar3->InstallGenerators).
      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      cmScriptGenerator::Generate
                (&(*ppcVar14)->super_cmScriptGenerator,(ostream *)local_278,&local_2a0,&local_338);
      ppcVar14 = ppcVar14 + 1;
    } while (ppcVar14 !=
             (pcVar3->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  GenerateTargetInstallRules(this,(ostream *)local_278,&local_2a0,&local_338);
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmStateSnapshot::GetChildren(&local_318,(cmStateSnapshot *)local_380);
  if (local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  # Include the install script for each subdirectory.\n",0x36);
    if (local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar2 = &local_300.field_2;
      this_00 = local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_380,this_00);
        local_300._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"EXCLUDE_FROM_ALL","");
        bVar15 = cmStateDirectory::GetPropertyAsBool((cmStateDirectory *)local_380,&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != paVar2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if (!bVar15) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_380,this_00);
          pcVar6 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_380);
          std::__cxx11::string::string((string *)&local_300,pcVar6,&local_389);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_300);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"  include(\"",0xb);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,local_300._M_dataplus._M_p,
                               local_300._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/cmake_install.cmake\")",0x16)
          ;
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != paVar2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = this_00 + 1;
      } while (this_00 !=
               local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"endif()\n\n",9);
  }
  if ((char)local_388 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
               ,0x11e);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_2e0,local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n"
               ,0x46);
  }
  if (local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_318.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,(long)local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");

#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if (!prefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix_win32)) {
      prefix_win32 = "C:";
    }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (project_name && project_name[0]) {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
    } else {
      prefix_win32 += "/InstalledCMakeProject";
    }
    prefix = prefix_win32.c_str();
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!prefix) {
    prefix = "/usr/local";
  }
#endif
  if (const char* stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", CM_NULLPTR };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::vector<std::string>::iterator i = configurationTypes.begin();
         i != configurationTypes.end(); ++i) {
      if (cmSystemTools::UpperCase(*i) == *c) {
        default_config = *i;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << "string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX "
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (const char* so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (const char* crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Ask each install generator to write its code.
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  for (std::vector<cmInstallGenerator*>::const_iterator gi =
         installers.begin();
       gi != installers.end(); ++gi) {
    (*gi)->Generate(fout, config, configurationTypes);
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  std::vector<cmStateSnapshot> children =
    this->Makefile->GetStateSnapshot().GetChildren();
  if (!children.empty()) {
    fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
    fout << "  # Include the install script for each subdirectory.\n";
    for (std::vector<cmStateSnapshot>::const_iterator ci = children.begin();
         ci != children.end(); ++ci) {
      if (!ci->GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        std::string odir = ci->GetDirectory().GetCurrentBinary();
        cmSystemTools::ConvertToUnixSlashes(odir);
        fout << "  include(\"" << odir << "/cmake_install.cmake\")"
             << std::endl;
      }
    }
    fout << "\n";
    fout << "endif()\n\n";
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}